

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::DecomposeColumn
          (TPZSkylMatrix<double> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  int64_t local_10;
  
  ppdVar2 = (this->fElem).fStore;
  pdVar3 = ppdVar2[prevcol];
  lVar6 = (prevcol - ((long)ppdVar2[prevcol + 1] - (long)pdVar3 >> 3)) + 1;
  lVar5 = (col - ((long)ppdVar2[col + 1] - (long)ppdVar2[col] >> 3)) + 1;
  if (lVar5 < lVar6) {
    lVar5 = lVar6;
  }
  local_10 = col;
  if (prevcol < lVar5) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
    return;
  }
  pdVar4 = ppdVar2[col] + (col - lVar5);
  dVar7 = 0.0;
  for (lVar5 = prevcol * 8 + lVar5 * -8; lVar5 != 0; lVar5 = lVar5 + -8) {
    dVar1 = *pdVar4;
    pdVar4 = pdVar4 + -1;
    dVar7 = dVar7 + *(double *)((long)pdVar3 + lVar5) * dVar1;
  }
  dVar7 = *pdVar4 - dVar7;
  *pdVar4 = dVar7;
  if (pdVar4 == pdVar3) {
    if (ABS(dVar7) < 1e-10) {
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_10);
      dVar7 = 1.0;
    }
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
  }
  else {
    dVar7 = dVar7 / *pdVar3;
  }
  *pdVar4 = dVar7;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}